

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

Position * __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Position::operator--(Position *this)

{
  char *pcVar1;
  
  pcVar1 = this->m_pos;
  this->m_pos = pcVar1 + -1;
  if (pcVar1[-1] == '\n') {
    this->line = this->line + -1;
    this->col = this->m_last_col;
    return this;
  }
  this->col = this->col + -1;
  return this;
}

Assistant:

constexpr Position &operator--() noexcept {
          --m_pos;
          if (*m_pos == '\n') {
            --line;
            col = m_last_col;
          } else {
            --col;
          }
          return *this;
        }